

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkDarSeqSweep2(Abc_Ntk_t *pNtk,Ssw_Pars_t *pPars)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *pAig;
  Aig_Man_t *p;
  Abc_Obj_t *pObj_00;
  int local_44;
  int i;
  Abc_Obj_t *pObj;
  Aig_Man_t *pTemp;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pNtkAig;
  Ssw_Pars_t *pPars_local;
  Abc_Ntk_t *pNtk_local;
  
  pAig = Abc_NtkToDar(pNtk,0,1);
  if (pAig == (Aig_Man_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    p = Ssw_SignalCorrespondence(pAig,pPars);
    if (pPars->fFlopVerbose != 0) {
      Abc_NtkPrintLatchEquivClasses(pNtk,pAig);
    }
    Aig_ManStop(pAig);
    if (p == (Aig_Man_t *)0x0) {
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    else {
      iVar1 = Aig_ManRegNum(p);
      iVar2 = Abc_NtkLatchNum(pNtk);
      if (iVar1 < iVar2) {
        pMan = (Aig_Man_t *)Abc_NtkFromDarSeqSweep(pNtk,p);
      }
      else {
        pMan = (Aig_Man_t *)Abc_NtkFromDar(pNtk,p);
        for (local_44 = 0; iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)&(pMan->Ghost).field_0x18),
            local_44 < iVar1; local_44 = local_44 + 1) {
          pObj_00 = Abc_NtkBox((Abc_Ntk_t *)pMan,local_44);
          iVar1 = Abc_ObjIsLatch(pObj_00);
          if (iVar1 != 0) {
            Abc_LatchSetInit0(pObj_00);
          }
        }
      }
      Aig_ManStop(p);
      pNtk_local = (Abc_Ntk_t *)pMan;
    }
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarSeqSweep2( Abc_Ntk_t * pNtk, Ssw_Pars_t * pPars )
{
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan, * pTemp;

    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return NULL;

    pMan = Ssw_SignalCorrespondence( pTemp = pMan, pPars );

    if ( pPars->fFlopVerbose )
        Abc_NtkPrintLatchEquivClasses(pNtk, pTemp);

    Aig_ManStop( pTemp );
    if ( pMan == NULL )
        return NULL;

    if ( Aig_ManRegNum(pMan) < Abc_NtkLatchNum(pNtk) )
        pNtkAig = Abc_NtkFromDarSeqSweep( pNtk, pMan );
    else
    {
        Abc_Obj_t * pObj;
        int i;
        pNtkAig = Abc_NtkFromDar( pNtk, pMan );
        Abc_NtkForEachLatch( pNtkAig, pObj, i )
            Abc_LatchSetInit0( pObj );
    }
    Aig_ManStop( pMan );
    return pNtkAig;
}